

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder_tests.cpp
# Opt level: O0

void __thiscall
json_stream_encoder_reset_test_fixture::json_stream_encoder_reset_test_fixture
          (json_stream_encoder_reset_test_fixture *this)

{
  stream_sink<char> *this_00;
  basic_json_options<char> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> *in_stack_00000108;
  basic_json_encode_options<char> *in_stack_00000110;
  stream_sink<char> *in_stack_00000118;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *in_stack_00000120;
  string_type *in_stack_fffffffffffffde8;
  basic_json_options<char> *in_stack_fffffffffffffdf0;
  basic_json_options<char> *in_stack_fffffffffffffe00;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe18;
  allocator<char> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  string local_1b8 [32];
  basic_json_options<char> local_198;
  
  this_02 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)in_RDI);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)(this_02[0xb].field_2._M_local_buf + 8));
  this_01 = (allocator<char> *)&in_RDI[0x17].field_2;
  jsoncons::stream_sink<char>::stream_sink((stream_sink<char> *)this_01,in_stack_fffffffffffffe18);
  memset(&local_198,0,0x148);
  jsoncons::basic_json_options<char>::basic_json_options(in_stack_fffffffffffffe00);
  jsoncons::basic_json_options<char>::indent_size(&local_198,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)in_RDI,this_01);
  this_00 = (stream_sink<char> *)
            jsoncons::basic_json_options<char>::new_line_chars
                      (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  pbVar1 = jsoncons::basic_json_options<char>::spaces_around_comma
                     ((basic_json_options<char> *)this_00,no_spaces);
  pbVar1 = (basic_json_options<char> *)&(pbVar1->super_basic_json_decode_options<char>).field_0x30;
  std::allocator<char>::allocator();
  jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
  basic_json_encoder(in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  std::allocator<char>::~allocator(&local_1ba);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  jsoncons::basic_json_options<char>::~basic_json_options(pbVar1);
  jsoncons::stream_sink<char>::~stream_sink(this_00);
  return;
}

Assistant:

json_stream_encoder_reset_test_fixture()
        : encoder(output1,
                  json_options().indent_size(0).new_line_chars("")
                      .spaces_around_comma(spaces_option::no_spaces))
    {}